

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void __thiscall EOServer::~EOServer(EOServer *this)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  pointer ppCVar2;
  World *this_00;
  vector<Client_*,_std::allocator<Client_*>_> *pvVar3;
  vector<Client_*,_std::allocator<Client_*>_> *__range3;
  _List_node_base *p_Var4;
  pointer ppCVar5;
  
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_00201940;
  plVar1 = &(this->super_Server).clients;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var4->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var4 != (_List_node_base *)plVar1) {
    Client::Close((Client *)p_Var4[1]._M_next,false);
  }
  while ((this->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
         _M_node._M_size != 0) {
    pvVar3 = Server::Select(&this->super_Server,0.1);
    if (pvVar3 != (vector<Client_*,_std::allocator<Client_*>_> *)0x0) {
      ppCVar5 = (pvVar3->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar2 = (pvVar3->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar5 != ppCVar2) {
        do {
          EOClient::Tick((EOClient *)*ppCVar5);
          ppCVar5 = ppCVar5 + 1;
        } while (ppCVar5 != ppCVar2);
        ppCVar5 = (pvVar3->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pvVar3->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppCVar5) {
          (pvVar3->super__Vector_base<Client_*,_std::allocator<Client_*>_>)._M_impl.
          super__Vector_impl_data._M_finish = ppCVar5;
        }
      }
    }
    Server::BuryTheDead(&this->super_Server);
  }
  operator_delete(this->sln,8);
  this_00 = this->world;
  if (this_00 != (World *)0x0) {
    World::~World(this_00);
  }
  operator_delete(this_00,0x948);
  std::
  _Hashtable<IPAddress,_std::pair<const_IPAddress,_double>,_std::allocator<std::pair<const_IPAddress,_double>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->connection_log)._M_h);
  Server::~Server(&this->super_Server);
  return;
}

Assistant:

EOServer::~EOServer()
{
	// All clients must be fully closed before the world ends
	UTIL_FOREACH(this->clients, client)
	{
		client->Close();
	}

	// Spend up to 2 seconds shutting down
	while (this->clients.size() > 0)
	{
		std::vector<Client *> *active_clients = this->Select(0.1);

		if (active_clients)
		{
			UTIL_FOREACH(*active_clients, client)
			{
				EOClient *eoclient = static_cast<EOClient *>(client);
				eoclient->Tick();
			}

			active_clients->clear();
		}

		this->BuryTheDead();
	}

	delete this->sln;
	delete this->world;
}